

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sheet.hpp
# Opt level: O0

Cell * __thiscall Excel::Sheet::cell(Sheet *this,size_t row,size_t column)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  ulong in_RDX;
  ulong in_RSI;
  vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
  *in_RDI;
  Cell *local_8;
  
  sVar1 = std::
          vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
          ::size(in_RDI);
  if ((sVar1 != 0) &&
     (sVar1 = std::
              vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
              ::size(in_RDI), in_RSI <= sVar1 - 1)) {
    pvVar2 = std::
             vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
             ::operator[](in_RDI,0);
    sVar1 = std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>::size(pvVar2);
    if (in_RDX <= sVar1 - 1) {
      pvVar2 = std::
               vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
               ::operator[](in_RDI,in_RSI);
      pvVar3 = std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>::operator[](pvVar2,in_RDX);
      return pvVar3;
    }
  }
  local_8 = (Cell *)(in_RDI + 1);
  return local_8;
}

Assistant:

inline const Cell &
Sheet::cell( size_t row, size_t column ) const
{
	if( m_cells.size() > 0 )
	{
		if( m_cells.size() - 1 < row || m_cells[ 0 ].size() - 1 < column )
			return m_dummyCell;
		else
			return m_cells[ row ][ column ];
	}

	return m_dummyCell;
}